

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

void __thiscall
helics::FederateState::closeInterface(FederateState *this,InterfaceHandle handle,InterfaceType type)

{
  pointer pSVar1;
  GlobalHandle *pGVar2;
  pointer pGVar3;
  PublicationInfo *pPVar4;
  InputInfo *this_00;
  EndpointInfo *this_01;
  undefined3 in_register_00000011;
  int iVar5;
  SubscriberInformation *sub;
  pointer pSVar6;
  GlobalHandle *pGVar7;
  ActionMessage rem;
  undefined1 local_e0 [16];
  GlobalHandle local_d0;
  Time local_c0;
  
  iVar5 = CONCAT31(in_register_00000011,type);
  if (iVar5 == 0x65) {
    this_01 = InterfaceInfo::getEndpoint(&this->interfaceInformation,handle);
    if (this_01 == (EndpointInfo *)0x0) {
      return;
    }
    EndpointInfo::clearQueue(this_01);
    return;
  }
  if (iVar5 == 0x69) {
    this_00 = InterfaceInfo::getInput(&this->interfaceInformation,handle);
    if (this_00 == (InputInfo *)0x0) {
      return;
    }
    ActionMessage::ActionMessage((ActionMessage *)local_e0,cmd_remove_subscriber);
    local_e0._8_8_ = this_00->id;
    local_c0.internalTimeCode = (this->time_granted).internalTimeCode;
    pGVar7 = (this_00->input_sources).
             super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl
             .super__Vector_impl_data._M_start;
    pGVar2 = (this_00->input_sources).
             super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (pGVar7 != pGVar2) {
      do {
        local_d0 = *pGVar7;
        routeMessage(this,(ActionMessage *)local_e0);
        pGVar7 = pGVar7 + 1;
      } while (pGVar7 != pGVar2);
    }
    pGVar3 = (this_00->input_sources).
             super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((this_00->input_sources).
        super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
        super__Vector_impl_data._M_finish != pGVar3) {
      (this_00->input_sources).
      super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = pGVar3;
    }
    InputInfo::clearFutureData(this_00);
  }
  else {
    if (iVar5 != 0x70) {
      return;
    }
    pPVar4 = InterfaceInfo::getPublication(&this->interfaceInformation,handle);
    if (pPVar4 == (PublicationInfo *)0x0) {
      return;
    }
    ActionMessage::ActionMessage((ActionMessage *)local_e0,cmd_remove_publication);
    local_e0._8_8_ = pPVar4->id;
    local_c0.internalTimeCode = (this->time_granted).internalTimeCode;
    pSVar6 = (pPVar4->subscribers).
             super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar1 = (pPVar4->subscribers).
             super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar6 != pSVar1) {
      do {
        local_d0 = pSVar6->id;
        routeMessage(this,(ActionMessage *)local_e0);
        pSVar6 = pSVar6 + 1;
      } while (pSVar6 != pSVar1);
    }
    std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::
    _M_erase_at_end(&pPVar4->subscribers,
                    (pPVar4->subscribers).
                    super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ActionMessage::~ActionMessage((ActionMessage *)local_e0);
  return;
}

Assistant:

void FederateState::closeInterface(InterfaceHandle handle, InterfaceType type)
{
    switch (type) {
        case InterfaceType::PUBLICATION: {
            auto* pub = interfaceInformation.getPublication(handle);
            if (pub != nullptr) {
                ActionMessage rem(CMD_REMOVE_PUBLICATION);
                rem.setSource(pub->id);
                rem.actionTime = time_granted;
                for (const auto& sub : pub->subscribers) {
                    rem.setDestination(sub.id);
                    routeMessage(rem);
                }
                pub->subscribers.clear();
            }
        } break;
        case InterfaceType::ENDPOINT: {
            auto* ept = interfaceInformation.getEndpoint(handle);
            if (ept != nullptr) {
                ept->clearQueue();
            }
        } break;
        case InterfaceType::INPUT: {
            auto* ipt = interfaceInformation.getInput(handle);
            if (ipt != nullptr) {
                ActionMessage rem(CMD_REMOVE_SUBSCRIBER);
                rem.setSource(ipt->id);
                rem.actionTime = time_granted;
                for (auto& pub : ipt->input_sources) {
                    rem.setDestination(pub);
                    routeMessage(rem);
                }
                ipt->input_sources.clear();
                ipt->clearFutureData();
            }
        } break;
        default:
            break;
    }
}